

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

Vec_Int_t * Saig_TsiComputeTransient(Saig_Tsim_t *p,int nPref)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int *local_40;
  
  uVar1 = p->pAig->nRegs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < nPref - 1U) {
    iVar4 = nPref;
  }
  pVVar3->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar3->pArray = (int *)0x0;
    pVVar3->nSize = nPref;
  }
  else {
    local_40 = (int *)malloc((long)iVar4 << 2);
    pVVar3->pArray = local_40;
    pVVar3->nSize = nPref;
    if (local_40 != (int *)0x0) {
      memset(local_40,0,(long)nPref << 2);
      goto LAB_006bf5b3;
    }
  }
  local_40 = (int *)0x0;
LAB_006bf5b3:
  if (0 < (int)uVar1) {
    pVVar2 = p->vStates;
    uVar5 = 0;
    uVar8 = 0xffffffff;
    uVar6 = 0xffffffff;
    do {
      uVar9 = (ulong)pVVar2->nSize;
      if (0 < (long)uVar9) {
        uVar10 = uVar5 * 2 & 0x1e;
        uVar11 = 0;
        uVar7 = uVar8;
        do {
          uVar8 = *(uint *)((long)pVVar2->pArray[uVar11] + (ulong)(uVar5 >> 4) * 4);
          uVar8 = (uint)((uVar8 >> uVar10 & 1) != 0) | (uVar8 >> ((char)uVar10 + 1U & 0x1f)) * 2 & 2
          ;
          if (uVar8 == 0) {
            __assert_fail("ValueThis != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigPhase.c"
                          ,0x10f,"Vec_Int_t *Saig_TsiComputeTransient(Saig_Tsim_t *, int)");
          }
          if (uVar7 != uVar8) {
            uVar6 = uVar11 & 0xffffffff;
          }
          uVar11 = uVar11 + 1;
          uVar7 = uVar8;
        } while (uVar9 != uVar11);
      }
      if ((uVar8 != 3) && ((int)uVar6 < nPref)) {
        if ((int)uVar6 < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        local_40[uVar6] = local_40[uVar6] + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Saig_TsiComputeTransient( Saig_Tsim_t * p, int nPref )
{
    Vec_Int_t * vCounters;
    unsigned * pState;
    int ValueThis = -1, ValuePrev = -1, StepPrev = -1;
    int i, k, nRegs = p->pAig->nRegs;
    vCounters = Vec_IntStart( nPref );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
        {
            ValueThis = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
//printf( "%s", (ValueThis == 1)? "0" : ((ValueThis == 2)? "1" : "x") );
            assert( ValueThis != 0 );
            if ( ValuePrev != ValueThis )
            {
                ValuePrev = ValueThis;
                StepPrev  = k;
            }
        }
//printf( "\n" );
        if ( ValueThis == SAIG_XVSX )
            continue;
        if ( StepPrev >= nPref )
            continue;
        Vec_IntAddToEntry( vCounters, StepPrev, 1 );
    }
    Vec_IntForEachEntry( vCounters, ValueThis, i )
    {
        if ( ValueThis == 0 )
            continue;
//        printf( "%3d : %3d\n", i, ValueThis );
    }
    return vCounters;
}